

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValue * QCborValue::fromCbor(QCborStreamReader *reader)

{
  bool bVar1;
  Code CVar2;
  uint uVar3;
  QCborContainerPrivate *pQVar4;
  QCborStreamReader *in_RSI;
  anon_union_8_2_4ee71171_for_Element_0 *in_RDI;
  long in_FS_OFFSET;
  Element EVar5;
  QCborStreamReader *in_stack_00000048;
  QCborContainerPrivate *in_stack_00000050;
  Type t;
  QCborValue *result;
  Element e;
  QCborContainerPrivate *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QCborStreamReader *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  int remainingRecursionDepth;
  QCborStreamReader *in_stack_ffffffffffffff78;
  anon_union_8_2_4ee71171_for_Element_0 *reader_00;
  Type local_4a;
  Type TStack_30;
  Code local_24 [7];
  long local_8;
  
  remainingRecursionDepth = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[2].container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  reader_00 = in_RDI;
  QCborValue((QCborValue *)in_RDI);
  local_4a = QCborStreamReader::type(in_RSI);
  local_24[0] = (Code)QCborStreamReader::lastError((QCborStreamReader *)in_stack_ffffffffffffff50);
  CVar2 = QCborError::operator_cast_to_Code((QCborError *)local_24);
  if (CVar2 != NoError) {
    local_4a = Invalid;
  }
  uVar3 = (uint)local_4a;
  if ((uVar3 != 0) && (uVar3 != 0x20)) {
    if ((uVar3 == 0x40) || (uVar3 == 0x60)) {
      in_RDI->value = 0;
      bVar1 = QCborStreamReader::isString((QCborStreamReader *)0x471371);
      *(Type *)(in_RDI + 2) = (uint)bVar1 << 5 | ByteArray;
      pQVar4 = (QCborContainerPrivate *)operator_new(0x40);
      QCborContainerPrivate::QCborContainerPrivate(in_stack_ffffffffffffff50);
      in_RDI[1].container = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)in_stack_ffffffffffffff50);
      QCborContainerPrivate::decodeStringFromCbor(in_stack_00000050,in_stack_00000048);
      goto LAB_0047146f;
    }
    if ((uVar3 == 0x80) || (uVar3 == 0xa0)) {
      in_RDI->value = -1;
      bVar1 = QCborStreamReader::isArray((QCborStreamReader *)0x4713f1);
      *(uint *)(in_RDI + 2) = ((byte)~bVar1 & 1 | 4) << 5;
      pQVar4 = createContainerFromCbor((QCborStreamReader *)reader_00,(int)((ulong)in_RDI >> 0x20));
      in_RDI[1].container = pQVar4;
      goto LAB_0047146f;
    }
    if (uVar3 == 0xc0) {
      taggedValueFromCbor(in_stack_ffffffffffffff78,remainingRecursionDepth);
      operator=((QCborValue *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                (QCborValue *)in_stack_ffffffffffffff50);
      ~QCborValue((QCborValue *)in_stack_ffffffffffffff50);
      goto LAB_0047146f;
    }
    if ((uVar3 != 0xe0) && (2 < uVar3 - 0xf9)) {
      if (uVar3 == 0xff) {
        *(Type *)(in_RDI + 2) = Invalid;
      }
      goto LAB_0047146f;
    }
  }
  EVar5 = decodeBasicValueFromCbor(in_stack_ffffffffffffff60);
  in_RDI->value = (qint64)EVar5.field_0;
  TStack_30 = EVar5.type;
  *(Type *)(in_RDI + 2) = TStack_30;
LAB_0047146f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QCborValue *)reader_00;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue QCborValue::fromCbor(QCborStreamReader &reader)
{
    QCborValue result;
    auto t = reader.type();
    if (reader.lastError() != QCborError::NoError)
        t = QCborStreamReader::Invalid;

    switch (t) {
    // basic types, no container needed:
    case QCborStreamReader::UnsignedInteger:
    case QCborStreamReader::NegativeInteger:
    case QCborStreamReader::SimpleType:
    case QCborStreamReader::Float16:
    case QCborStreamReader::Float:
    case QCborStreamReader::Double: {
        Element e = decodeBasicValueFromCbor(reader);
        result.n = e.value;
        result.t = e.type;
        break;
    }

    case QCborStreamReader::Invalid:
        result.t = QCborValue::Invalid;
        break;              // probably a decode error

    // strings
    case QCborStreamReader::ByteArray:
    case QCborStreamReader::String:
        result.n = 0;
        result.t = reader.isString() ? String : ByteArray;
        result.container = new QCborContainerPrivate;
        result.container->ref.ref();
        result.container->decodeStringFromCbor(reader);
        break;

    // containers
    case QCborStreamReader::Array:
    case QCborStreamReader::Map:
        result.n = -1;
        result.t = reader.isArray() ? Array : Map;
        result.container = createContainerFromCbor(reader, MaximumRecursionDepth);
        break;

    // tag
    case QCborStreamReader::Tag:
        result = taggedValueFromCbor(reader, MaximumRecursionDepth);
        break;
    }

    return result;
}